

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O3

HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine *engine)

{
  HTS_SStreamSet *sss;
  HTS_Boolean HVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  
  sss = &engine->sss;
  HVar1 = HTS_SStreamSet_create
                    (sss,&engine->ms,&engine->label,(engine->condition).phoneme_alignment_flag,
                     (engine->condition).speed,(engine->condition).duration_iw,
                     (engine->condition).parameter_iw,(engine->condition).gv_iw);
  if (HVar1 == '\x01') {
    dVar5 = (engine->condition).additional_half_tone;
    HVar1 = '\x01';
    if (((dVar5 != 0.0) || (NAN(dVar5))) &&
       (sVar2 = HTS_SStreamSet_get_total_state(sss), sVar2 != 0)) {
      sVar2 = 0;
      do {
        dVar4 = HTS_SStreamSet_get_mean(sss,1,sVar2,0);
        dVar4 = (engine->condition).additional_half_tone * 0.05776226504666211 + dVar4;
        dVar5 = 2.995732273553991;
        if ((2.995732273553991 <= dVar4) && (dVar5 = dVar4, 9.903487552536127 < dVar4)) {
          dVar5 = 9.903487552536127;
        }
        HTS_SStreamSet_set_mean(sss,1,sVar2,0,dVar5);
        HTS_ModelSet_get_nstate(&engine->ms);
        sVar2 = sVar2 + 1;
        sVar3 = HTS_SStreamSet_get_total_state(sss);
      } while (sVar2 < sVar3);
    }
  }
  else {
    HTS_Engine_refresh(engine);
    HVar1 = '\0';
  }
  return HVar1;
}

Assistant:

static HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine * engine)
{
   size_t i, state_index, model_index;
   double f;

   if (HTS_SStreamSet_create(&engine->sss, &engine->ms, &engine->label, engine->condition.phoneme_alignment_flag, engine->condition.speed, engine->condition.duration_iw, engine->condition.parameter_iw, engine->condition.gv_iw) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (engine->condition.additional_half_tone != 0.0) {
      state_index = 0;
      model_index = 0;
      for (i = 0; i < HTS_Engine_get_total_state(engine); i++) {
         f = HTS_Engine_get_state_mean(engine, 1, i, 0);
         f += engine->condition.additional_half_tone * HALF_TONE;
         if (f < MIN_LF0)
            f = MIN_LF0;
         else if (f > MAX_LF0)
            f = MAX_LF0;
         HTS_Engine_set_state_mean(engine, 1, i, 0, f);
         state_index++;
         if (state_index >= HTS_Engine_get_nstate(engine)) {
            state_index = 0;
            model_index++;
         }
      }
   }
   return TRUE;
}